

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O0

int __thiscall
YAML::RegEx::MatchUnchecked<YAML::StreamCharSource>(RegEx *this,StreamCharSource *source)

{
  RegEx *this_00;
  RegEx *in_RSI;
  StreamCharSource *in_RDI;
  StreamCharSource *unaff_retaddr;
  RegEx *in_stack_00000008;
  StreamCharSource *in_stack_00000020;
  RegEx *in_stack_00000028;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  this_00 = (RegEx *)(ulong)(uint)in_RDI->m_offset;
  switch(this_00) {
  case (RegEx *)0x0:
    iVar1 = MatchOpEmpty<YAML::StreamCharSource>(this_00,in_RDI);
    break;
  case (RegEx *)0x1:
    iVar1 = MatchOpMatch<YAML::StreamCharSource>(in_RSI,(StreamCharSource *)this_00);
    break;
  case (RegEx *)0x2:
    iVar1 = MatchOpRange<YAML::StreamCharSource>
                      ((RegEx *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                      );
    break;
  case (RegEx *)0x3:
    iVar1 = MatchOpOr<YAML::StreamCharSource>(in_stack_00000008,unaff_retaddr);
    break;
  case (RegEx *)0x4:
    iVar1 = MatchOpAnd<YAML::StreamCharSource>(in_stack_00000008,unaff_retaddr);
    break;
  case (RegEx *)0x5:
    iVar1 = MatchOpNot<YAML::StreamCharSource>(in_RSI,(StreamCharSource *)this_00);
    break;
  case (RegEx *)0x6:
    iVar1 = MatchOpSeq<YAML::StreamCharSource>(in_stack_00000028,in_stack_00000020);
    break;
  default:
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

inline int RegEx::MatchUnchecked(const Source& source) const {
  switch (m_op) {
    case REGEX_EMPTY:
      return MatchOpEmpty(source);
    case REGEX_MATCH:
      return MatchOpMatch(source);
    case REGEX_RANGE:
      return MatchOpRange(source);
    case REGEX_OR:
      return MatchOpOr(source);
    case REGEX_AND:
      return MatchOpAnd(source);
    case REGEX_NOT:
      return MatchOpNot(source);
    case REGEX_SEQ:
      return MatchOpSeq(source);
  }

  return -1;
}